

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semaphore.cpp
# Opt level: O3

PAL_ERROR CorUnix::InternalReleaseSemaphore
                    (CPalThread *pthr,HANDLE hSemaphore,LONG lReleaseCount,LPLONG lpPreviousCount)

{
  PAL_ERROR PVar1;
  uint uVar2;
  PAL_ERROR PVar3;
  int iVar4;
  char *__format;
  ulong uVar5;
  int *local_50;
  SemaphoreImmutableData *pSemaphoreData;
  IPalObject *pobjSemaphore;
  ISynchStateController *pssc;
  LONG lOldCount;
  
  pSemaphoreData = (SemaphoreImmutableData *)0x0;
  pobjSemaphore = (IPalObject *)0x0;
  if (pthr == (CPalThread *)0x0) {
    fprintf(_stderr,"] %s %s:%d","InternalReleaseSemaphore",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchobj/semaphore.cpp"
            ,0x1ca);
    fprintf(_stderr,"Expression: NULL != pthr\n");
  }
  if (PAL_InitializeChakraCoreCalled == false) goto LAB_003411d6;
  PVar3 = 0x57;
  if (0 < lReleaseCount) {
    PVar1 = (**(code **)(*g_pObjectManager + 0x28))
                      (g_pObjectManager,pthr,hSemaphore,&aotSempahore,0,&pSemaphoreData);
    if (PVar1 == 0) {
      uVar2 = (**(code **)(*(long *)pSemaphoreData + 0x10))(pSemaphoreData,&local_50);
      if (uVar2 == 0) {
        uVar2 = (**(code **)(*(long *)pSemaphoreData + 0x28))(pSemaphoreData,pthr,&pobjSemaphore);
        if (uVar2 == 0) {
          uVar2 = (**pobjSemaphore->_vptr_IPalObject)(pobjSemaphore,(long)&pssc + 4);
          if (uVar2 == 0) {
            iVar4 = *local_50;
            if (iVar4 < pssc._4_4_) {
              fprintf(_stderr,"] %s %s:%d","InternalReleaseSemaphore",
                      "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchobj/semaphore.cpp"
                      ,0x203);
              fprintf(_stderr,"Expression: lOldCount <= pSemaphoreData->lMaximumCount\n");
              iVar4 = *local_50;
            }
            if (lReleaseCount <= iVar4 - pssc._4_4_) {
              PVar3 = (*pobjSemaphore->_vptr_IPalObject[2])
                                (pobjSemaphore,(ulong)(uint)lReleaseCount);
              if (PVar3 == 0) {
                PVar3 = 0;
                if (lpPreviousCount != (LPLONG)0x0) {
                  *lpPreviousCount = pssc._4_4_;
                }
              }
              else {
                fprintf(_stderr,"] %s %s:%d","InternalReleaseSemaphore",
                        "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchobj/semaphore.cpp"
                        ,0x20e);
                fprintf(_stderr,"Error %d incrementing signal count\n",(ulong)PVar3);
              }
            }
            goto LAB_003410c4;
          }
          uVar5 = (ulong)uVar2;
          fprintf(_stderr,"] %s %s:%d","InternalReleaseSemaphore",
                  "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchobj/semaphore.cpp"
                  ,0x1ff);
          __format = "Error %d obtaining current signal count\n";
        }
        else {
          uVar5 = (ulong)uVar2;
          fprintf(_stderr,"] %s %s:%d","InternalReleaseSemaphore",
                  "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchobj/semaphore.cpp"
                  ,0x1f7);
          __format = "Error %d obtaining synch state controller\n";
        }
      }
      else {
        uVar5 = (ulong)uVar2;
        fprintf(_stderr,"] %s %s:%d","InternalReleaseSemaphore",
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchobj/semaphore.cpp"
                ,0x1ec);
        __format = "Error %d obtaining object data\n";
      }
      PVar3 = (PAL_ERROR)uVar5;
      fprintf(_stderr,__format,uVar5);
    }
    else {
      PVar3 = PVar1;
      if (PAL_InitializeChakraCoreCalled == false) goto LAB_003411d6;
    }
  }
LAB_003410c4:
  if (pobjSemaphore != (IPalObject *)0x0) {
    (*pobjSemaphore->_vptr_IPalObject[6])();
  }
  if (pSemaphoreData != (SemaphoreImmutableData *)0x0) {
    (**(code **)(*(long *)pSemaphoreData + 0x40))(pSemaphoreData,pthr);
  }
  if (PAL_InitializeChakraCoreCalled != false) {
    return PVar3;
  }
LAB_003411d6:
  abort();
}

Assistant:

PAL_ERROR
CorUnix::InternalReleaseSemaphore(
    CPalThread *pthr,
    HANDLE hSemaphore,
    LONG lReleaseCount,
    LPLONG lpPreviousCount
    )
{
    PAL_ERROR palError = NO_ERROR;
    IPalObject *pobjSemaphore = NULL;
    ISynchStateController *pssc = NULL;
    SemaphoreImmutableData *pSemaphoreData;
    LONG lOldCount;

    _ASSERTE(NULL != pthr);

    ENTRY("InternalReleaseSempahore(pthr=%p, hSemaphore=%p, lReleaseCount=%d, "
        "lpPreviousCount=%p)\n",
        pthr,
        hSemaphore,
        lReleaseCount,
        lpPreviousCount
        );

    if (0 >= lReleaseCount)
    {
        palError = ERROR_INVALID_PARAMETER;
        goto InternalReleaseSemaphoreExit;
    }

    palError = g_pObjectManager->ReferenceObjectByHandle(
        pthr,
        hSemaphore,
        &aotSempahore,
        0, // Should be SEMAPHORE_MODIFY_STATE; currently ignored (no Win32 security)
        &pobjSemaphore
        );

    if (NO_ERROR != palError)
    {
        ERROR("Unable to obtain object for handle %p (error %d)!\n", hSemaphore, palError);
        goto InternalReleaseSemaphoreExit;
    }

    palError = pobjSemaphore->GetImmutableData(reinterpret_cast<void**>(&pSemaphoreData));

    if (NO_ERROR != palError)
    {
        ASSERT("Error %d obtaining object data\n", palError);
        goto InternalReleaseSemaphoreExit;
    }

    palError = pobjSemaphore->GetSynchStateController(
        pthr,
        &pssc
        );

    if (NO_ERROR != palError)
    {
        ASSERT("Error %d obtaining synch state controller\n", palError);
        goto InternalReleaseSemaphoreExit;
    }

    palError = pssc->GetSignalCount(&lOldCount);

    if (NO_ERROR != palError)
    {
        ASSERT("Error %d obtaining current signal count\n", palError);
        goto InternalReleaseSemaphoreExit;
    }

    _ASSERTE(lOldCount <= pSemaphoreData->lMaximumCount);
    if (lReleaseCount > pSemaphoreData->lMaximumCount - lOldCount)
    {
        palError = ERROR_INVALID_PARAMETER;
        goto InternalReleaseSemaphoreExit;
    }

    palError = pssc->IncrementSignalCount(lReleaseCount);

    if (NO_ERROR != palError)
    {
        ASSERT("Error %d incrementing signal count\n", palError);
        goto InternalReleaseSemaphoreExit;
    }

    if (NULL != lpPreviousCount)
    {
        *lpPreviousCount = lOldCount;
    }

InternalReleaseSemaphoreExit:

    if (NULL != pssc)
    {
        pssc->ReleaseController();
    }

    if (NULL != pobjSemaphore)
    {
        pobjSemaphore->ReleaseReference(pthr);
    }

    LOGEXIT("InternalReleaseSemaphore returns %d\n", palError);

    return palError;
}